

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O3

char ** lua_rl_complete(char *text,int start,int end)

{
  char cVar1;
  char cVar2;
  lua_State *L;
  size_t sVar3;
  size_t __n;
  int idx;
  int iVar4;
  ushort **ppuVar5;
  char **__ptr;
  char *pcVar6;
  int suf;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  size_t __n_00;
  size_t local_70;
  dmlist local_58;
  long local_38;
  
  L = lua_rl_L;
  cVar1 = *text;
  if ((((long)cVar1 != 0) && (ppuVar5 = __ctype_b_loc(), cVar1 != '_')) &&
     (((*ppuVar5)[cVar1] & 0x400) == 0)) {
    return (char **)0x0;
  }
  local_58.allocated = 0;
  local_58.matchlen = 0;
  local_58.list = (char **)0x0;
  local_58.idx = 0;
  idx = lua_gettop(L);
  lua_pushvalue(L,-0x2712);
  __n_00 = (size_t)(end - start);
  if (end - start != 0) {
    lVar10 = __n_00 + (__n_00 == 0);
    local_70 = 0;
    lVar8 = 0;
    local_38 = lVar10;
LAB_0010945b:
    if ((text[lVar8] == '.') || (text[lVar8] == ':')) {
      uVar9 = 0x15;
      do {
        iVar4 = lua_type(L,-1);
        if (iVar4 == 5) {
          lua_pushlstring(L,text + local_70,lVar8 - local_70);
          lua_rawget(L,-2);
          iVar4 = lua_type(L,-1);
          if (iVar4 != 0) goto LAB_001094f0;
          lua_settop(L,-2);
        }
        uVar9 = uVar9 - 1;
        if ((uVar9 < 2) || (iVar4 = lua_rl_getmetaindex(L), iVar4 == 0)) {
          lua_settop(L,-2);
          goto LAB_001095b4;
        }
      } while( true );
    }
    goto LAB_00109502;
  }
LAB_00109247:
  pcVar7 = "and";
  lVar10 = 1;
  local_70 = 0;
  do {
    iVar4 = strncmp(pcVar7,text,__n_00);
    if ((iVar4 == 0) && (iVar4 = lua_rl_dmadd(&local_58,(char *)0x0,0,pcVar7,0x20), iVar4 != 0))
    goto LAB_001095b4;
    pcVar7 = lua_rl_keywords[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
LAB_001092a8:
  lVar10 = 0;
  do {
    iVar4 = lua_type(L,-1);
    if ((iVar4 == 5) && ((lVar10 == 0 || (iVar4 = lua_rawequal(L,-1,-0x2712), iVar4 == 0)))) {
      lua_pushnil(L);
      while (iVar4 = lua_next(L,-2), iVar4 != 0) {
        iVar4 = lua_type(L,-2);
        if (iVar4 == 4) {
          pcVar7 = lua_tolstring(L,-2,(size_t *)0x0);
          iVar4 = strncmp(pcVar7,text + local_70,__n_00 - local_70);
          if (iVar4 == 0) {
            ppuVar5 = __ctype_b_loc();
            cVar1 = *pcVar7;
            if (((long)cVar1 == 0x5f) || (((*ppuVar5)[cVar1] & 0x400) != 0)) {
              pcVar6 = pcVar7 + 1;
              do {
                cVar2 = *pcVar6;
                if ((long)cVar2 == 0) {
                  if ((cVar1 != '_') || (text[local_70] == '_')) {
                    iVar4 = lua_type(L,-1);
                    suf = 0x20;
                    if (iVar4 == 7) {
                      iVar4 = lua_getmetatable(L,-1);
                      if (iVar4 != 0) {
                        lua_settop(L,-2);
                        suf = 0x3a;
                      }
                    }
                    else if (iVar4 == 6) {
                      suf = 0x28;
                    }
                    else if (iVar4 == 5) {
                      suf = 0x2e;
                    }
                    iVar4 = lua_rl_dmadd(&local_58,text,local_70,pcVar7,suf);
                    if (iVar4 != 0) goto LAB_001095b4;
                  }
                  break;
                }
                pcVar6 = pcVar6 + 1;
              } while ((cVar2 == '_') || (((*ppuVar5)[cVar2] & 0xc00) != 0));
            }
          }
        }
        lua_settop(L,-2);
      }
    }
    if (lVar10 == 0x13) break;
    lVar10 = lVar10 + 1;
    iVar4 = lua_rl_getmetaindex(L);
  } while (iVar4 != 0);
  __n = local_58.matchlen;
  sVar3 = local_58.idx;
  if (local_58.idx != 0) {
    pcVar7 = (char *)malloc(local_58.matchlen + 1);
    __ptr = local_58.list;
    *local_58.list = pcVar7;
    if (pcVar7 != (char *)0x0) {
      memcpy(pcVar7,local_58.list[1],__n);
      pcVar7[__n] = '\0';
      if ((sVar3 + 1 < local_58.allocated) ||
         (__ptr = (char **)realloc(__ptr,local_58.allocated * 8 + 0x100), __ptr != (char **)0x0)) {
        __ptr[sVar3 + 1] = (char *)0x0;
        lua_settop(L,idx);
        _rl_completion_suppress_append = 1;
        return __ptr;
      }
    }
  }
LAB_001095b4:
  lua_settop(L,idx);
  return (char **)0x0;
LAB_001094f0:
  lua_replace(L,-2);
  local_70 = lVar8 + 1;
  lVar10 = local_38;
LAB_00109502:
  lVar8 = lVar8 + 1;
  if (lVar8 == lVar10) goto code_r0x0010950b;
  goto LAB_0010945b;
code_r0x0010950b:
  if (local_70 != 0) goto LAB_001092a8;
  goto LAB_00109247;
}

Assistant:

static char **lua_rl_complete(const char *text, int start, int end)
{
  lua_State *L = lua_rl_L;
  dmlist ml;
  const char *s;
  size_t i, n, dot, loop;
  int savetop;

  if (!(text[0] == '\0' || isalpha(text[0]) || text[0] == '_')) return NULL;

  ml.list = NULL;
  ml.idx = ml.allocated = ml.matchlen = 0;

  savetop = lua_gettop(L);
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  for (n = (size_t)(end-start), i = dot = 0; i < n; i++)
    if (text[i] == '.' || text[i] == ':') {
      if (!lua_rl_getfield(L, text+dot, i-dot))
	goto error;  /* Invalid prefix. */
      dot = i+1;  /* Points to first char after dot/colon. */
    }

  /* Add all matches against keywords if there is no dot/colon. */
  if (dot == 0)
    for (i = 0; (s = lua_rl_keywords[i]) != NULL; i++)
      if (!strncmp(s, text, n) && lua_rl_dmadd(&ml, NULL, 0, s, ' '))
	goto error;

  /* Add all valid matches from all tables/metatables. */
  loop = 0;  /* Avoid infinite metatable loops. */
  do {
    if (lua_istable(L, -1) &&
	(loop == 0 || !lua_rawequal(L, -1, LUA_GLOBALSINDEX)))
      for (lua_pushnil(L); lua_next(L, -2); lua_pop(L, 1))
	if (lua_type(L, -2) == LUA_TSTRING) {
	  s = lua_tostring(L, -2);
	  /* Only match names starting with '_' if explicitly requested. */
	  if (!strncmp(s, text+dot, n-dot) && valididentifier(s) &&
	      (*s != '_' || text[dot] == '_')) {
	    int suf = ' ';  /* Default suffix is a space. */
	    switch (lua_type(L, -1)) {
	    case LUA_TTABLE:	suf = '.'; break;  /* No way to guess ':'. */
	    case LUA_TFUNCTION:	suf = '('; break;
	    case LUA_TUSERDATA:
	      if (lua_getmetatable(L, -1)) { lua_pop(L, 1); suf = ':'; }
	      break;
	    }
	    if (lua_rl_dmadd(&ml, text, dot, s, suf)) goto error;
	  }
	}
  } while (++loop < 20 && lua_rl_getmetaindex(L));

  if (ml.idx == 0) {
error:
    lua_settop(L, savetop);
    return NULL;
  } else {
    /* list[0] holds the common prefix of all matches (may be ""). */
    /* If there is only one match, list[0] and list[1] will be the same. */
    if (!(ml.list[0] = (char *)malloc(sizeof(char)*(ml.matchlen+1))))
      goto error;
    memcpy(ml.list[0], ml.list[1], ml.matchlen);
    ml.list[0][ml.matchlen] = '\0';
    /* Add the NULL list terminator. */
    if (lua_rl_dmadd(&ml, NULL, 0, NULL, 0)) goto error;
  }

  lua_settop(L, savetop);
#if RL_READLINE_VERSION >= 0x0600
  rl_completion_suppress_append = 1;
#endif
  return ml.list;
}